

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeSetPageSize(Btree *p,int pageSize,int nReserve,int iFix)

{
  int *piVar1;
  int iVar2;
  BtShared *pBVar3;
  u32 uVar4;
  int iVar5;
  u8 *p_00;
  uint nReserve_00;
  
  pBVar3 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pBVar3->nReserveWanted = (u8)nReserve;
  nReserve_00 = pBVar3->pageSize - pBVar3->usableSize;
  if ((int)nReserve_00 <= nReserve) {
    nReserve_00 = nReserve;
  }
  if ((pBVar3->btsFlags & 2) == 0) {
    if ((pageSize - 0x200U < 0xfe01) && ((pageSize + 0x1ffffU & pageSize) == 0)) {
      uVar4 = 0x400;
      if ((int)nReserve_00 < 0x21) {
        uVar4 = pageSize;
      }
      if (pageSize != 0x200) {
        uVar4 = pageSize;
      }
      pBVar3->pageSize = uVar4;
      if (pBVar3->pTmpSpace != (u8 *)0x0) {
        p_00 = pBVar3->pTmpSpace + -4;
        pBVar3->pTmpSpace = p_00;
        pcache1Free(p_00);
        pBVar3->pTmpSpace = (u8 *)0x0;
      }
    }
    iVar5 = sqlite3PagerSetPagesize(pBVar3->pPager,&pBVar3->pageSize,nReserve_00);
    pBVar3->usableSize = pBVar3->pageSize - (nReserve_00 & 0xffff);
    if (iFix != 0) {
      *(byte *)&pBVar3->btsFlags = (byte)pBVar3->btsFlags | 2;
    }
    if (p->sharable == '\0') {
      return iVar5;
    }
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    iVar2 = *piVar1;
  }
  else {
    if (p->sharable == '\0') {
      return 8;
    }
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    iVar2 = *piVar1;
    iVar5 = 8;
  }
  if (iVar2 == 0) {
    unlockBtreeMutex(p);
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPageSize(Btree *p, int pageSize, int nReserve, int iFix){
  int rc = SQLITE_OK;
  int x;
  BtShared *pBt = p->pBt;
  assert( nReserve>=0 && nReserve<=255 );
  sqlite3BtreeEnter(p);
  pBt->nReserveWanted = nReserve;
  x = pBt->pageSize - pBt->usableSize;
  if( nReserve<x ) nReserve = x;
  if( pBt->btsFlags & BTS_PAGESIZE_FIXED ){
    sqlite3BtreeLeave(p);
    return SQLITE_READONLY;
  }
  assert( nReserve>=0 && nReserve<=255 );
  if( pageSize>=512 && pageSize<=SQLITE_MAX_PAGE_SIZE &&
        ((pageSize-1)&pageSize)==0 ){
    assert( (pageSize & 7)==0 );
    assert( !pBt->pCursor );
    if( nReserve>32 && pageSize==512 ) pageSize = 1024;
    pBt->pageSize = (u32)pageSize;
    freeTempSpace(pBt);
  }
  rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
  pBt->usableSize = pBt->pageSize - (u16)nReserve;
  if( iFix ) pBt->btsFlags |= BTS_PAGESIZE_FIXED;
  sqlite3BtreeLeave(p);
  return rc;
}